

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ustar_filename_encoding.c
# Opt level: O1

void test_ustar_filename_encoding(void)

{
  int iVar1;
  char *pcVar2;
  archive *paVar3;
  archive_entry *paVar4;
  size_t used;
  char buff [4096];
  size_t local_1040;
  undefined1 local_1038 [4104];
  
  pcVar2 = setlocale(6,"en_US.UTF-8");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                   ,L'\'');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    paVar3 = archive_write_new();
    iVar1 = archive_write_set_format_ustar(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'0',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options(paVar3,"hdrcharset=CP866");
    if (iVar1 == 0) {
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'8',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,anon_var_dwarf_3825e);
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'A',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'E',local_1038,"buff",anon_var_dwarf_382b6,"\"\\xAF\\xE0\\xA8\"",3,"3",
                          (void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                     ,L'2');
      test_skipping("This system cannot convert character-set from UTF-8 to CP866.");
      archive_write_free(paVar3);
    }
  }
  pcVar2 = setlocale(6,"ru_RU.KOI8-R");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                   ,L'Q');
    test_skipping("KOI8-R locale not available on this system.");
  }
  else {
    paVar3 = archive_write_new();
    iVar1 = archive_write_set_format_ustar(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'Z',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options(paVar3,"hdrcharset=UTF-8");
    if (iVar1 == 0) {
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'b',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,anon_var_dwarf_38344);
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'i',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'k',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'o',local_1038,"buff",anon_var_dwarf_3825e,
                          "\"\\xD0\\xBF\\xD1\\x80\\xD0\\xB8\"",6,"6",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                     ,L'\\');
      test_skipping("This system cannot convert character-set from KOI8-R to UTF-8.");
      archive_write_free(paVar3);
    }
  }
  pcVar2 = setlocale(6,"ru_RU.KOI8-R");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                   ,L'{');
    test_skipping("KOI8-R locale not available on this system.");
  }
  else {
    paVar3 = archive_write_new();
    iVar1 = archive_write_set_format_ustar(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'\x84',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options(paVar3,"hdrcharset=CP866");
    if (iVar1 == 0) {
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'\x8c',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,anon_var_dwarf_38344);
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'\x93',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'\x95',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'\x99',local_1038,"buff",anon_var_dwarf_382b6,"\"\\xAF\\xE0\\xA8\"",3,
                          "3",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                     ,L'\x86');
      test_skipping("This system cannot convert character-set from KOI8-R to CP866.");
      archive_write_free(paVar3);
    }
  }
  pcVar2 = setlocale(6,"Russian_Russia");
  if ((pcVar2 == (char *)0x0) && (pcVar2 = setlocale(6,"ru_RU.CP1251"), pcVar2 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                   ,L'¦');
    test_skipping("KOI8-R locale not available on this system.");
  }
  else {
    paVar3 = archive_write_new();
    iVar1 = archive_write_set_format_ustar(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'¯',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options(paVar3,"hdrcharset=UTF-8");
    if (iVar1 == 0) {
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'·',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,anon_var_dwarf_3838c);
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'¾',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'À',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'Ä',local_1038,"buff",anon_var_dwarf_3825e,
                          "\"\\xD0\\xBF\\xD1\\x80\\xD0\\xB8\"",6,"6",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                     ,L'±');
      test_skipping("This system cannot convert character-set from KOI8-R to UTF-8.");
      archive_write_free(paVar3);
    }
  }
  pcVar2 = setlocale(6,"ru_RU.CP1251");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                   ,L'Ó');
    test_skipping("KOI8-R locale not available on this system.");
  }
  else {
    paVar3 = archive_write_new();
    iVar1 = archive_write_set_format_ustar(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'Ü',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                        (void *)0x0);
    iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'Þ',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
    paVar4 = archive_entry_new2(paVar3);
    archive_entry_set_pathname(paVar4,anon_var_dwarf_3838c);
    archive_entry_set_filetype(paVar4,0x8000);
    archive_entry_set_size(paVar4,0);
    iVar1 = archive_write_header(paVar3,paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'å',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                        (void *)0x0);
    archive_entry_free(paVar4);
    iVar1 = archive_write_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'ç',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'ë',local_1038,"buff",anon_var_dwarf_3838c,"\"\\xEF\\xF0\\xE8\"",3,"3",
                        (void *)0x0);
  }
  pcVar2 = setlocale(6,"Russian_Russia");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                   ,L'ü');
    test_skipping("Russian_Russia locale not available on this system.");
  }
  else {
    paVar3 = archive_write_new();
    iVar1 = archive_write_set_format_ustar(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'ą',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                        (void *)0x0);
    iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'ć',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
    paVar4 = archive_entry_new2(paVar3);
    archive_entry_set_pathname(paVar4,anon_var_dwarf_3838c);
    archive_entry_set_filetype(paVar4,0x8000);
    archive_entry_set_size(paVar4,0);
    iVar1 = archive_write_header(paVar3,paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'Ď',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                        (void *)0x0);
    archive_entry_free(paVar4);
    iVar1 = archive_write_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'Đ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'Ĕ',local_1038,"buff",anon_var_dwarf_382b6,"\"\\xAF\\xE0\\xA8\"",3,"3",
                        (void *)0x0);
  }
  pcVar2 = setlocale(6,"ja_JP.eucJP");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                   ,L'Ġ');
    test_skipping("eucJP locale not available on this system.");
  }
  else {
    paVar3 = archive_write_new();
    iVar1 = archive_write_set_format_ustar(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'Ĩ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options(paVar3,"hdrcharset=UTF-8");
    if (iVar1 == 0) {
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'İ',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,anon_var_dwarf_55d70 + 0xb);
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'ĸ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'ĺ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'Ľ',local_1038,"buff",anon_var_dwarf_55e5c + 0x10,
                          "\"\\xE8\\xA1\\xA8.txt\"",7,"7",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                     ,L'Ī');
      test_skipping("This system cannot convert character-set from eucJP to UTF-8.");
      archive_write_free(paVar3);
    }
  }
  pcVar2 = setlocale(6,"ja_JP.eucJP");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                   ,L'ŉ');
    test_skipping("eucJP locale not available on this system.");
  }
  else {
    paVar3 = archive_write_new();
    iVar1 = archive_write_set_format_ustar(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'ő',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options(paVar3,"hdrcharset=CP932");
    if (iVar1 == 0) {
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'ř',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,anon_var_dwarf_55d70 + 0xb);
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'š',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'ţ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                          ,L'Ŧ',local_1038,"buff",anon_var_dwarf_9d84d + 0xb,"\"\\x95\\x5C.txt\"",6
                          ,"6",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                     ,L'œ');
      test_skipping("This system cannot convert character-set from eucJP to CP932.");
      archive_write_free(paVar3);
    }
  }
  pcVar2 = setlocale(6,"Japanese_Japan");
  if ((pcVar2 == (char *)0x0) && (pcVar2 = setlocale(6,"ja_JP.SJIS"), pcVar2 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                   ,L'ų');
    test_skipping("CP932/SJIS locale not available on this system.");
    return;
  }
  paVar3 = archive_write_new();
  iVar1 = archive_write_set_format_ustar(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                      ,L'Ż',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                      (void *)0x0);
  iVar1 = archive_write_set_options(paVar3,"hdrcharset=UTF-8");
  if (iVar1 == 0) {
    iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'ƃ',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
    paVar4 = archive_entry_new2(paVar3);
    archive_entry_set_pathname(paVar4,anon_var_dwarf_9d84d + 0xb);
    archive_entry_set_filetype(paVar4,0x8000);
    archive_entry_set_size(paVar4,0);
    iVar1 = archive_write_header(paVar3,paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'Ƌ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                        (void *)0x0);
    archive_entry_free(paVar4);
    iVar1 = archive_write_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'ƍ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'Ɛ',local_1038,"buff",anon_var_dwarf_55e5c + 0x10,
                        "\"\\xE8\\xA1\\xA8.txt\"",7,"7",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                   ,L'Ž');
    test_skipping("This system cannot convert character-set from CP932/SJIS to UTF-8.");
    archive_write_free(paVar3);
  }
  return;
}

Assistant:

static void
test_ustar_filename_encoding_UTF8_CP866(void)
{
  	struct archive *a;
  	struct archive_entry *entry;
	char buff[4096];
	size_t used;

	if (NULL == setlocale(LC_ALL, "en_US.UTF-8")) {
		skipping("en_US.UTF-8 locale not available on this system.");
		return;
	}

	/*
	 * Verify that UTF-8 filenames are correctly translated into CP866
	 * and stored with hdrcharset=CP866 option.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_ustar(a));
	if (archive_write_set_options(a, "hdrcharset=CP866") != ARCHIVE_OK) {
		skipping("This system cannot convert character-set"
		    " from UTF-8 to CP866.");
		archive_write_free(a);
		return;
	}
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set a UTF-8 filename. */
	archive_entry_set_pathname(entry, "\xD0\xBF\xD1\x80\xD0\xB8");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Above three characters in UTF-8 should translate to the following
	 * three characters in CP866. */
	assertEqualMem(buff, "\xAF\xE0\xA8", 3);
}